

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

void enet_peer_disconnect_later(ENetPeer *peer,enet_uint32 data)

{
  int iVar1;
  
  if (peer->state - ENET_PEER_STATE_CONNECTED < 2) {
    iVar1 = enet_peer_has_outgoing_commands(peer);
    if (iVar1 != 0) {
      peer->state = ENET_PEER_STATE_DISCONNECT_LATER;
      peer->eventData = data;
      return;
    }
  }
  enet_peer_disconnect(peer,data);
  return;
}

Assistant:

void enet_peer_disconnect_later(ENetPeer *peer, enet_uint32 data) {
        if ((peer->state == ENET_PEER_STATE_CONNECTED || peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
            enet_peer_has_outgoing_commands(peer)
        ) {
            peer->state     = ENET_PEER_STATE_DISCONNECT_LATER;
            peer->eventData = data;
        } else {
            enet_peer_disconnect(peer, data);
        }
    }